

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall enact::Lexer::number(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  undefined4 local_1c;
  TokenType type;
  Lexer *this_local;
  
  while( true ) {
    cVar1 = peek(this);
    bVar2 = isDigit(this,cVar1);
    if (!bVar2) break;
    advance(this);
  }
  local_1c = INTEGER;
  cVar1 = peek(this);
  if (cVar1 == '.') {
    cVar1 = peekNext(this);
    bVar2 = isDigit(this,cVar1);
    if (bVar2) {
      local_1c = FLOAT;
      advance(this);
      while( true ) {
        cVar1 = peek(this);
        bVar2 = isDigit(this,cVar1);
        if (!bVar2) break;
        advance(this);
      }
    }
  }
  makeToken(__return_storage_ptr__,this,local_1c);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::number() {
        while (isDigit(peek())) advance();

        TokenType type = TokenType::INTEGER;

        if (peek() == '.' && isDigit(peekNext())) {
            type = TokenType::FLOAT;
            advance();
            while (isDigit(peek())) advance();
        }

        return makeToken(type);
    }